

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall
ON_SimpleArray<ON_3fPoint>::Append(ON_SimpleArray<ON_3fPoint> *this,int count,ON_3fPoint *buffer)

{
  uint uVar1;
  size_t __n;
  uint uVar2;
  ON_3fPoint *__dest;
  uint uVar3;
  uint uVar4;
  
  if (buffer != (ON_3fPoint *)0x0 && 0 < count) {
    __n = (ulong)(uint)count * 0xc;
    uVar1 = this->m_count;
    uVar3 = uVar1 + count;
    uVar2 = this->m_capacity;
    if ((int)uVar2 < (int)uVar3) {
      if (((int)uVar1 < 8) || ((ulong)((long)(int)uVar1 * 0xc) < 0x10000001)) {
        uVar4 = 4;
        if (2 < (int)uVar1) {
          uVar4 = uVar1 * 2;
        }
      }
      else {
        uVar4 = 0x155555d;
        if (uVar1 < 0x155555d) {
          uVar4 = uVar1;
        }
        uVar4 = uVar4 + uVar1;
      }
      if ((int)uVar3 < (int)uVar4) {
        uVar3 = uVar4;
      }
      if (buffer < this->m_a + (int)uVar2 && this->m_a <= buffer) {
        __dest = (ON_3fPoint *)onmalloc(__n);
        memcpy(__dest,buffer,__n);
        uVar2 = this->m_capacity;
        buffer = __dest;
      }
      else {
        __dest = (ON_3fPoint *)0x0;
      }
      if (uVar2 < uVar3) {
        SetCapacity(this,(long)(int)uVar3);
      }
      memcpy(this->m_a + this->m_count,buffer,__n);
      if (__dest != (ON_3fPoint *)0x0) {
        onfree(__dest);
      }
    }
    else {
      memcpy(this->m_a + (int)uVar1,buffer,__n);
    }
    this->m_count = this->m_count + count;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( int count, const T* buffer ) 
{
  if ( count > 0 && nullptr != buffer ) 
  {
    const size_t sizeof_buffer = count * sizeof(T);
    void* temp = nullptr;
    if ( count + m_count > m_capacity ) 
    {
      int newcapacity = NewCapacity();
      if ( newcapacity < count + m_count )
        newcapacity = count + m_count;
      if ( buffer >= m_a && buffer < (m_a + m_capacity) )
      {
        // buffer is in the block of memory about to be reallocated
        temp = onmalloc(sizeof_buffer);
        memcpy(temp, buffer, sizeof_buffer);
        buffer = (const T*)temp;
      }
      Reserve( newcapacity );
    }
    memcpy( (void*)(m_a + m_count), (void*)(buffer), sizeof_buffer );
    if (nullptr != temp)
      onfree(temp);
    m_count += count;
  }
}